

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O2

NewLineIdentifier duckdb::CSVSniffer::DetectNewLineDelimiter(CSVBufferManager *buffer_manager)

{
  bool bVar1;
  bool bVar2;
  CSVBufferHandle *pCVar3;
  data_ptr_t pdVar4;
  NewLineIdentifier NVar5;
  NewLineIdentifier NVar6;
  idx_t i;
  ulong uVar7;
  shared_ptr<duckdb::CSVBufferHandle,_true> buffer;
  
  CSVBufferManager::GetBuffer((CSVBufferManager *)&buffer,(idx_t)buffer_manager);
  pCVar3 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&buffer);
  pdVar4 = BufferHandle::Ptr(&pCVar3->handle);
  bVar1 = false;
  uVar7 = 0;
  do {
    pCVar3 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&buffer);
    NVar5 = SINGLE_R;
    if (pCVar3->actual_size <= uVar7) {
LAB_018b3f81:
      NVar6 = SINGLE_N;
      if (bVar1) {
        NVar6 = NVar5;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&buffer.internal.
                  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return NVar6;
    }
    bVar2 = true;
    if (pdVar4[uVar7] != '\r') {
      if (pdVar4[uVar7] == '\n') {
        NVar5 = CARRY_ON;
        goto LAB_018b3f81;
      }
      bVar2 = bVar1;
      if (bVar1) goto LAB_018b3f81;
    }
    bVar1 = bVar2;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

NewLineIdentifier CSVSniffer::DetectNewLineDelimiter(CSVBufferManager &buffer_manager) {
	// Get first buffer
	auto buffer = buffer_manager.GetBuffer(0);
	auto buffer_ptr = buffer->Ptr();
	bool carriage_return = false;
	bool n = false;
	for (idx_t i = 0; i < buffer->actual_size; i++) {
		if (buffer_ptr[i] == '\r') {
			carriage_return = true;
		} else if (buffer_ptr[i] == '\n') {
			n = true;
			break;
		} else if (carriage_return) {
			break;
		}
	}
	if (carriage_return && n) {
		return NewLineIdentifier::CARRY_ON;
	}
	if (carriage_return) {
		return NewLineIdentifier::SINGLE_R;
	}
	return NewLineIdentifier::SINGLE_N;
}